

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool,true,false>
               (interval_t *ldata,interval_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  int64_t iVar1;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  interval_t left;
  interval_t left_00;
  interval_t left_01;
  bool bVar2;
  undefined8 *puVar3;
  int64_t *piVar4;
  ValidityMask *in_RCX;
  void *in_RDX;
  void *in_RSI;
  idx_t *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  byte in_R9B;
  interval_t rentry_2;
  interval_t lentry_2;
  idx_t i;
  interval_t rentry_1;
  interval_t lentry_1;
  idx_t start;
  interval_t rentry;
  interval_t lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  idx_t in_stack_fffffffffffffed0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffed8;
  int64_t in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  int64_t in_stack_fffffffffffffef0;
  idx_t in_stack_ffffffffffffff00;
  ValidityMask *local_f0;
  idx_t local_a8;
  ValidityMask *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  idx_t local_88;
  idx_t local_80;
  undefined8 local_78;
  undefined8 local_70;
  idx_t local_68;
  idx_t local_60;
  ValidityMask *local_58;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  ValidityMask *local_38;
  byte local_29;
  TemplatedValidityMask<unsigned_long> *local_28;
  ValidityMask *local_20;
  void *local_18;
  void *local_10;
  idx_t *local_8;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RSI,(void *)((long)in_RSI + (long)in_RCX * 0x10),in_RDX,
             (void *)((long)in_RDX + (long)in_RCX),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x50);
  bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_28);
  if (bVar2) {
    for (local_f0 = (ValidityMask *)0x0; local_f0 < local_20;
        local_f0 = (ValidityMask *)
                   ((long)&(local_f0->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)
        ) {
      piVar4 = (int64_t *)((long)local_10 + (long)local_f0 * 0x10);
      iVar1 = *piVar4;
      left_01.micros = iVar1;
      left_01._0_8_ = local_8[1];
      right_01.micros = *local_8;
      right_01._0_8_ = piVar4[1];
      bVar2 = BinarySingleArgumentOperatorWrapper::
              Operation<bool,duckdb::GreaterThanEquals,duckdb::interval_t,duckdb::interval_t,bool>
                        (SUB81((ulong)iVar1 >> 0x38,0),left_01,right_01,local_f0,*local_8);
      *(bool *)((long)local_18 + (long)local_f0) = bVar2;
    }
  }
  else {
    local_38 = (ValidityMask *)0x0;
    local_40 = TemplatedValidityMask<unsigned_long>::EntryCount(0x520982);
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      local_58 = (ValidityMask *)
                 MinValue<unsigned_long>((unsigned_long)(local_38 + 2),(unsigned_long)local_20);
      bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar2) {
        for (; local_38 < local_58;
            local_38 = (ValidityMask *)
                       ((long)&(local_38->super_TemplatedValidityMask<unsigned_long>).validity_mask
                       + 1)) {
          local_88 = *local_8;
          local_80 = local_8[1];
          puVar3 = (undefined8 *)((long)local_10 + (long)local_38 * 0x10);
          local_98 = *puVar3;
          local_90 = puVar3[1];
          left.micros = in_stack_fffffffffffffef0;
          left.months = (int)in_stack_fffffffffffffee8;
          left.days = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
          right.micros = in_stack_fffffffffffffee0;
          right._0_8_ = in_stack_fffffffffffffed8;
          local_78 = local_98;
          local_70 = local_90;
          local_68 = local_88;
          local_60 = local_80;
          bVar2 = BinarySingleArgumentOperatorWrapper::
                  Operation<bool,duckdb::GreaterThanEquals,duckdb::interval_t,duckdb::interval_t,bool>
                            (SUB81(in_stack_fffffffffffffed0 >> 0x38,0),left,right,local_38,
                             in_stack_ffffffffffffff00);
          *(bool *)((long)local_18 + (long)local_38) = bVar2;
        }
      }
      else {
        bVar2 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        if (bVar2) {
          local_38 = local_58;
        }
        else {
          local_a0 = local_38;
          for (; local_38 < local_58;
              local_38 = (ValidityMask *)
                         ((long)&(local_38->super_TemplatedValidityMask<unsigned_long>).
                                 validity_mask + 1)) {
            local_a8 = (long)local_38 - (long)local_a0;
            bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_50,&local_a8);
            if (bVar2) {
              left_00.micros = in_stack_fffffffffffffef0;
              left_00.months = (int)in_stack_fffffffffffffee8;
              left_00.days = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
              right_00.micros = in_stack_fffffffffffffee0;
              right_00._0_8_ = in_stack_fffffffffffffed8;
              bVar2 = BinarySingleArgumentOperatorWrapper::
                      Operation<bool,duckdb::GreaterThanEquals,duckdb::interval_t,duckdb::interval_t,bool>
                                (SUB81(in_stack_fffffffffffffed0 >> 0x38,0),left_00,right_00,
                                 local_38,in_stack_ffffffffffffff00);
              *(bool *)((long)local_18 + (long)local_38) = bVar2;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}